

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_unary(ggml_compute_params *params,ggml_tensor *dst)

{
  float fVar1;
  size_t sVar2;
  ggml_tensor *pgVar3;
  size_t sVar4;
  int64_t iVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  ggml_tensor *src0;
  undefined8 uVar10;
  void *pvVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ggml_tensor *src0_1;
  uint uVar15;
  undefined1 auVar16 [16];
  float fVar17;
  
  uVar6 = ggml_get_unary_op(dst);
  switch(uVar6) {
  case 0:
    ggml_compute_forward_abs(params,dst);
    return;
  case 1:
    ggml_compute_forward_sgn(params,dst);
    return;
  case 2:
    ggml_compute_forward_neg(params,dst);
    return;
  case 3:
    ggml_compute_forward_step(params,dst);
    return;
  case 4:
    ggml_compute_forward_tanh(params,dst);
    return;
  case 5:
    ggml_compute_forward_elu(params,dst);
    return;
  case 6:
    ggml_compute_forward_relu(params,dst);
    return;
  case 7:
    ggml_compute_forward_sigmoid(params,dst);
    return;
  case 8:
    pgVar3 = dst->src[0];
    if (pgVar3->type == GGML_TYPE_F16) {
      iVar12 = params->ith;
      iVar8 = params->nth;
      iVar5 = pgVar3->ne[0];
      iVar7 = ggml_nrows(pgVar3);
      iVar8 = (iVar8 + -1 + iVar7) / iVar8;
      lVar13 = (long)iVar12 * (long)iVar8;
      iVar8 = iVar8 + (int)lVar13;
      if (iVar7 <= iVar8) {
        iVar8 = iVar7;
      }
      if ((int)lVar13 < iVar8) {
        sVar4 = dst->nb[1];
        sVar2 = pgVar3->nb[1];
        uVar15 = (uint)iVar5;
        pvVar9 = (void *)(sVar4 * lVar13 + (long)dst->data);
        pvVar11 = (void *)(sVar2 * lVar13 + (long)pgVar3->data);
        do {
          if (0 < (int)uVar15) {
            uVar14 = 0;
            do {
              *(ggml_fp16_t *)((long)pvVar9 + uVar14 * 2) =
                   ggml_table_gelu_f16[*(ushort *)((long)pvVar11 + uVar14 * 2)];
              uVar14 = uVar14 + 1;
            } while ((uVar15 & 0x7fffffff) != uVar14);
          }
          lVar13 = lVar13 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar4);
          pvVar11 = (void *)((long)pvVar11 + sVar2);
        } while (lVar13 != iVar8);
      }
    }
    else {
      if (pgVar3->type != GGML_TYPE_F32) {
        uVar10 = 0xa8e;
        goto LAB_00147930;
      }
      iVar12 = params->ith;
      iVar8 = params->nth;
      iVar5 = pgVar3->ne[0];
      iVar7 = ggml_nrows(pgVar3);
      iVar8 = (iVar8 + -1 + iVar7) / iVar8;
      lVar13 = (long)iVar12 * (long)iVar8;
      iVar8 = iVar8 + (int)lVar13;
      if (iVar7 <= iVar8) {
        iVar8 = iVar7;
      }
      if ((int)lVar13 < iVar8) {
        sVar4 = dst->nb[1];
        sVar2 = pgVar3->nb[1];
        uVar15 = (uint)iVar5;
        pvVar9 = (void *)(sVar4 * lVar13 + (long)dst->data);
        pvVar11 = (void *)(sVar2 * lVar13 + (long)pgVar3->data);
        do {
          if (0 < (int)uVar15) {
            uVar14 = 0;
            do {
              fVar1 = *(float *)((long)pvVar11 + uVar14 * 4);
              fVar17 = 0.0;
              if ((-10.0 < fVar1) && (fVar17 = fVar1, fVar1 < 10.0)) {
                auVar16 = vcvtps2ph_f16c(ZEXT416((uint)fVar1),0);
                uVar6 = vpextrw_avx(auVar16,0);
                dst = (ggml_tensor *)
                      (ulong)ggml_table_gelu_f16[CONCAT44((int)((ulong)dst >> 0x20),uVar6)];
                fVar17 = *(float *)(&ggml_table_f32_f16 + (long)dst * 4);
              }
              *(float *)((long)pvVar9 + uVar14 * 4) = fVar17;
              uVar14 = uVar14 + 1;
            } while ((uVar15 & 0x7fffffff) != uVar14);
          }
          lVar13 = lVar13 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar4);
          pvVar11 = (void *)((long)pvVar11 + sVar2);
        } while (lVar13 != iVar8);
      }
    }
    break;
  case 9:
    pgVar3 = dst->src[0];
    if (pgVar3->type == GGML_TYPE_F16) {
      iVar12 = params->ith;
      iVar8 = params->nth;
      iVar5 = pgVar3->ne[0];
      iVar7 = ggml_nrows(pgVar3);
      iVar8 = (iVar8 + -1 + iVar7) / iVar8;
      lVar13 = (long)iVar12 * (long)iVar8;
      iVar8 = iVar8 + (int)lVar13;
      if (iVar7 <= iVar8) {
        iVar8 = iVar7;
      }
      if ((int)lVar13 < iVar8) {
        sVar4 = pgVar3->nb[1];
        uVar15 = (uint)iVar5;
        pvVar9 = (void *)(sVar4 * lVar13 + (long)pgVar3->data);
        do {
          if (0 < (int)uVar15) {
            uVar14 = 0;
            do {
              fVar1 = *(float *)(&ggml_table_f32_f16 +
                                (ulong)*(ushort *)((long)pvVar9 + uVar14 * 2) * 4);
              fVar17 = expf(fVar1 * -1.702);
              auVar16 = vcvtps2ph_f16c(ZEXT416((uint)((1.0 / (fVar17 + 1.0)) * fVar1)),0);
              vpextrw_avx(auVar16,0);
              uVar14 = uVar14 + 1;
            } while ((uVar15 & 0x7fffffff) != uVar14);
          }
          lVar13 = lVar13 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar4);
        } while (lVar13 != iVar8);
      }
    }
    else {
      if (pgVar3->type != GGML_TYPE_F32) {
        uVar10 = 0xaf5;
        goto LAB_00147930;
      }
      iVar12 = params->ith;
      iVar8 = params->nth;
      iVar5 = pgVar3->ne[0];
      iVar7 = ggml_nrows(pgVar3);
      iVar8 = (iVar8 + -1 + iVar7) / iVar8;
      lVar13 = (long)iVar12 * (long)iVar8;
      iVar8 = iVar8 + (int)lVar13;
      if (iVar7 <= iVar8) {
        iVar8 = iVar7;
      }
      if ((int)lVar13 < iVar8) {
        sVar4 = dst->nb[1];
        sVar2 = pgVar3->nb[1];
        uVar15 = (uint)iVar5;
        pvVar9 = (void *)(sVar4 * lVar13 + (long)dst->data);
        pvVar11 = (void *)(sVar2 * lVar13 + (long)pgVar3->data);
        do {
          if (0 < (int)uVar15) {
            uVar14 = 0;
            do {
              auVar16 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar11 + uVar14 * 4)),0);
              uVar6 = vpextrw_avx(auVar16,0);
              dst = (ggml_tensor *)
                    (ulong)ggml_table_gelu_quick_f16[CONCAT44((int)((ulong)dst >> 0x20),uVar6)];
              *(undefined4 *)((long)pvVar9 + uVar14 * 4) =
                   *(undefined4 *)(&ggml_table_f32_f16 + (long)dst * 4);
              uVar14 = uVar14 + 1;
            } while ((uVar15 & 0x7fffffff) != uVar14);
          }
          lVar13 = lVar13 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar4);
          pvVar11 = (void *)((long)pvVar11 + sVar2);
        } while (lVar13 != iVar8);
      }
    }
    break;
  case 10:
    pgVar3 = dst->src[0];
    if (pgVar3->type == GGML_TYPE_F16) {
      iVar12 = params->ith;
      iVar8 = params->nth;
      iVar5 = pgVar3->ne[0];
      iVar7 = ggml_nrows(pgVar3);
      iVar8 = (iVar8 + -1 + iVar7) / iVar8;
      lVar13 = (long)iVar12 * (long)iVar8;
      iVar8 = iVar8 + (int)lVar13;
      if (iVar7 <= iVar8) {
        iVar8 = iVar7;
      }
      if ((int)lVar13 < iVar8) {
        sVar4 = pgVar3->nb[1];
        uVar15 = (uint)iVar5;
        pvVar9 = (void *)(sVar4 * lVar13 + (long)pgVar3->data);
        do {
          if (0 < (int)uVar15) {
            uVar14 = 0;
            do {
              fVar1 = *(float *)(&ggml_table_f32_f16 +
                                (ulong)*(ushort *)((long)pvVar9 + uVar14 * 2) * 4);
              auVar16._8_4_ = 0x80000000;
              auVar16._0_8_ = 0x8000000080000000;
              auVar16._12_4_ = 0x80000000;
              auVar16 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar16);
              fVar17 = expf(auVar16._0_4_);
              auVar16 = vcvtps2ph_f16c(ZEXT416((uint)(fVar1 / (fVar17 + 1.0))),0);
              vpextrw_avx(auVar16,0);
              uVar14 = uVar14 + 1;
            } while ((uVar15 & 0x7fffffff) != uVar14);
          }
          lVar13 = lVar13 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar4);
        } while (lVar13 != iVar8);
      }
    }
    else {
      if (pgVar3->type != GGML_TYPE_F32) {
        uVar10 = 0xb5c;
        goto LAB_00147930;
      }
      iVar12 = params->ith;
      iVar8 = params->nth;
      iVar5 = pgVar3->ne[0];
      iVar7 = ggml_nrows(pgVar3);
      iVar8 = (iVar8 + -1 + iVar7) / iVar8;
      lVar13 = (long)iVar12 * (long)iVar8;
      iVar12 = (int)lVar13;
      iVar8 = iVar8 + iVar12;
      if (iVar7 <= iVar8) {
        iVar8 = iVar7;
      }
      iVar7 = iVar8 - iVar12;
      if (iVar7 != 0 && iVar12 <= iVar8) {
        do {
          ggml_vec_silu_f32((int)iVar5,(float *)(dst->nb[1] * lVar13 + (long)dst->data),
                            (float *)(pgVar3->nb[1] * lVar13 + (long)pgVar3->data));
          lVar13 = lVar13 + 1;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
    }
    break;
  case 0xb:
    ggml_compute_forward_hardswish(params,dst);
    return;
  case 0xc:
    ggml_compute_forward_hardsigmoid(params,dst);
    return;
  case 0xd:
    ggml_compute_forward_exp(params,dst);
    return;
  default:
    uVar10 = 0x1e6b;
LAB_00147930:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,uVar10,"fatal error");
  }
  return;
}

Assistant:

void ggml_compute_forward_unary(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_unary_op op = ggml_get_unary_op(dst);

    switch (op) {
        case GGML_UNARY_OP_ABS:
            {
                ggml_compute_forward_abs(params, dst);
            } break;
        case GGML_UNARY_OP_SGN:
            {
                ggml_compute_forward_sgn(params, dst);
            } break;
        case GGML_UNARY_OP_NEG:
            {
                ggml_compute_forward_neg(params, dst);
            } break;
        case GGML_UNARY_OP_STEP:
            {
                ggml_compute_forward_step(params, dst);
            } break;
        case GGML_UNARY_OP_TANH:
            {
                ggml_compute_forward_tanh(params, dst);
            } break;
        case GGML_UNARY_OP_ELU:
            {
                ggml_compute_forward_elu(params, dst);
            } break;
        case GGML_UNARY_OP_RELU:
            {
                ggml_compute_forward_relu(params, dst);
            } break;
        case GGML_UNARY_OP_SIGMOID:
            {
                ggml_compute_forward_sigmoid(params, dst);
            } break;
        case GGML_UNARY_OP_GELU:
            {
                ggml_compute_forward_gelu(params, dst);
            } break;
        case GGML_UNARY_OP_GELU_QUICK:
            {
                ggml_compute_forward_gelu_quick(params, dst);
            } break;
        case GGML_UNARY_OP_SILU:
            {
                ggml_compute_forward_silu(params, dst);
            } break;
        case GGML_UNARY_OP_HARDSWISH:
            {
                ggml_compute_forward_hardswish(params, dst);
            } break;
        case GGML_UNARY_OP_HARDSIGMOID:
            {
                ggml_compute_forward_hardsigmoid(params, dst);
            } break;
        case GGML_UNARY_OP_EXP:
            {
                ggml_compute_forward_exp(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}